

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::replace_prelu_with_leaky_relu(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  bool bVar5;
  Layer *pLVar6;
  long lVar7;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar1 = (this->super_ModelWriter).layers;
  ppLVar2 = (pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar3 = (pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar7 = 0; (long)ppLVar2 - (long)ppLVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    bVar5 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar7]->type,"PReLU");
    if ((!bVar5) &&
       (pLVar4 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar7], *(int *)&pLVar4[1]._vptr_Layer == 1)) {
      fprintf(_stderr,"replace_prelu_with_leaky_relu %s\n",(pLVar4->name)._M_dataplus._M_p);
      pLVar6 = ncnn::create_layer("ReLU");
      std::__cxx11::string::assign((char *)&pLVar6->type);
      std::__cxx11::string::_M_assign((string *)&pLVar6->name);
      std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->bottoms,&pLVar4->bottoms);
      std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->tops,&pLVar4->tops);
      ncnn::ParamDict::ParamDict(&local_40);
      (*pLVar6->_vptr_Layer[2])(pLVar6,&local_40);
      *(undefined4 *)&pLVar6[1]._vptr_Layer = **(undefined4 **)&pLVar4[1].one_blob_only;
      (((this->super_ModelWriter).layers)->
      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar7] = pLVar6;
      (*pLVar4->_vptr_Layer[1])(pLVar4);
      ncnn::ParamDict::~ParamDict(&local_40);
    }
  }
  return 0;
}

Assistant:

int NetOptimize::replace_prelu_with_leaky_relu()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "PReLU")
            continue;

        ncnn::PReLU* prelu = (ncnn::PReLU*)layers[i];
        if (prelu->num_slope != 1)
            continue;

        fprintf(stderr, "replace_prelu_with_leaky_relu %s\n", prelu->name.c_str());

        ncnn::ReLU* relu = (ncnn::ReLU*)ncnn::create_layer("ReLU");

        relu->type = "ReLU";
        relu->name = prelu->name;
        relu->bottoms = prelu->bottoms;
        relu->tops = prelu->tops;

        ncnn::ParamDict pd;
        relu->load_param(pd);

        relu->slope = prelu->slope_data[0];

        layers[i] = relu;
        delete prelu;
    }

    return 0;
}